

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O1

size_t axl::err::pushError(StringRef *string)

{
  size_t sVar1;
  Error error;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  local_28.m_p = (ErrorHdr *)0x0;
  local_28.m_hdr = (BufHdr *)0x0;
  local_28.m_size = 0;
  sVar1 = Error::createStringError((Error *)&local_28,string);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0xffffffffffffffff;
  }
  else {
    sVar1 = pushError((ErrorRef *)&local_28);
  }
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
  return sVar1;
}

Assistant:

size_t
pushError(const sl::StringRef& string) {
	Error error;
	size_t result = error.createStringError(string);
	return result != -1 ? pushError(error) : -1;
}